

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_sps.c
# Opt level: O2

MPP_RET process_subsps(H264_SLICE_t *currSlice)

{
  bitread_ctx_t *p_bitctx;
  size_t size;
  size_t size_00;
  uint uVar1;
  h264d_cur_ctx_t *phVar2;
  MPP_RET MVar3;
  h264_subsps_t *cur_sps;
  h264_subsps_t *phVar4;
  RK_S32 *pRVar5;
  RK_S32 **ppRVar6;
  int iVar7;
  char *fmt;
  long lVar8;
  undefined8 uVar9;
  ulong uVar10;
  RK_S32 _out;
  ulong local_40;
  ulong local_38;
  
  phVar2 = currSlice->p_Cur;
  p_bitctx = &phVar2->bitctx;
  cur_sps = phVar2->subsps;
  if (cur_sps == (h264_subsps_t *)0x0) {
    cur_sps = (h264_subsps_t *)mpp_osal_calloc("process_subsps",0x10c0);
    currSlice->p_Cur->subsps = cur_sps;
  }
  memset(cur_sps,0,0x10c0);
  cur_sps->num_views_minus1 = -1;
  cur_sps->num_level_values_signalled_minus1 = -1;
  MVar3 = parser_sps(p_bitctx,&cur_sps->sps,currSlice->p_Dec);
  if (MVar3 < MPP_OK) {
    if (((byte)h264d_debug & 4) == 0) goto LAB_0018af71;
    uVar9 = 0x224;
  }
  else {
    iVar7 = (cur_sps->sps).profile_idc;
    if ((iVar7 != 0x80) && (iVar7 != 0x76)) goto LAB_0018ab84;
    MVar3 = mpp_read_bits(p_bitctx,1,&_out);
    (phVar2->bitctx).ret = MVar3;
    if (MVar3 == MPP_OK) {
      cur_sps->bit_equal_to_one = _out;
      if ((_out != 1 && ((byte)h264d_debug & 2) != 0) &&
         (_mpp_log_l(2,"h264d_sps","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "cur_subsps->bit_equal_to_one == 1","parser_subsps_ext",0x179),
         (mpp_debug._3_1_ & 0x10) != 0)) {
        abort();
      }
      MVar3 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
      (phVar2->bitctx).ret = MVar3;
      if (MVar3 == MPP_OK) {
        uVar10 = (ulong)(uint)_out;
        cur_sps->num_views_minus1 = _out;
        if (_out < 0x10) {
          local_38 = uVar10;
          if (-1 < _out) {
            size = uVar10 * 4 + 4;
            pRVar5 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",size);
            cur_sps->view_id = pRVar5;
            pRVar5 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",size);
            cur_sps->num_anchor_refs_l0 = pRVar5;
            pRVar5 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",size);
            cur_sps->num_anchor_refs_l1 = pRVar5;
            size_00 = uVar10 * 8 + 8;
            ppRVar6 = (RK_S32 **)mpp_osal_calloc("sps_mvc_extension",size_00);
            cur_sps->anchor_ref_l0 = ppRVar6;
            ppRVar6 = (RK_S32 **)mpp_osal_calloc("sps_mvc_extension",size_00);
            cur_sps->anchor_ref_l1 = ppRVar6;
            pRVar5 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",size);
            cur_sps->num_non_anchor_refs_l0 = pRVar5;
            pRVar5 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",size);
            cur_sps->num_non_anchor_refs_l1 = pRVar5;
            ppRVar6 = (RK_S32 **)mpp_osal_calloc("sps_mvc_extension",size_00);
            cur_sps->non_anchor_ref_l0 = ppRVar6;
            ppRVar6 = (RK_S32 **)mpp_osal_calloc("sps_mvc_extension",size_00);
            cur_sps->non_anchor_ref_l1 = ppRVar6;
            if ((((((cur_sps->view_id == (RK_S32 *)0x0) ||
                   (cur_sps->num_anchor_refs_l0 == (RK_S32 *)0x0)) ||
                  (cur_sps->num_anchor_refs_l1 == (RK_S32 *)0x0)) ||
                 ((cur_sps->anchor_ref_l0 == (RK_S32 **)0x0 ||
                  (cur_sps->anchor_ref_l1 == (RK_S32 **)0x0)))) ||
                ((cur_sps->num_non_anchor_refs_l0 == (RK_S32 *)0x0 ||
                 ((cur_sps->num_non_anchor_refs_l1 == (RK_S32 *)0x0 ||
                  (cur_sps->non_anchor_ref_l0 == (RK_S32 **)0x0)))))) || (ppRVar6 == (RK_S32 **)0x0)
               ) {
              MVar3 = MPP_ERR_MALLOC;
              if (((byte)h264d_debug & 1) != 0) {
                fmt = "malloc buffer error(%d).\n";
                uVar9 = 0x141;
                goto LAB_0018af17;
              }
              goto LAB_0018af1e;
            }
          }
          iVar7 = -1;
          if (-1 < (int)local_38) {
            iVar7 = (int)local_38;
          }
          local_40 = (long)iVar7 + 1;
          for (uVar10 = 0; local_40 != uVar10; uVar10 = uVar10 + 1) {
            MVar3 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
            (phVar2->bitctx).ret = MVar3;
            if (MVar3 != MPP_OK) goto LAB_0018acd0;
            cur_sps->view_id[uVar10] = _out;
          }
          iVar7 = (int)local_38;
          if (iVar7 < 1) {
            iVar7 = 0;
          }
          local_38 = (ulong)(iVar7 + 1);
          local_40 = 1;
          while (local_40 != local_38) {
            MVar3 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
            uVar10 = local_40;
            (phVar2->bitctx).ret = MVar3;
            if (MVar3 != MPP_OK) goto LAB_0018acd0;
            pRVar5 = cur_sps->num_anchor_refs_l0;
            pRVar5[local_40] = _out;
            lVar8 = (long)pRVar5[local_40];
            if (lVar8 != 0) {
              pRVar5 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",lVar8 << 2);
              cur_sps->anchor_ref_l0[uVar10] = pRVar5;
              if (cur_sps->anchor_ref_l0[uVar10] == (RK_S32 *)0x0) {
                MVar3 = MPP_ERR_MALLOC;
                if (((byte)h264d_debug & 1) == 0) goto LAB_0018af1e;
                fmt = "malloc buffer error(%d).\n";
                uVar9 = 0x14a;
                goto LAB_0018af17;
              }
              for (lVar8 = 0; lVar8 < cur_sps->num_anchor_refs_l0[uVar10]; lVar8 = lVar8 + 1) {
                MVar3 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
                (phVar2->bitctx).ret = MVar3;
                if (MVar3 != MPP_OK) goto LAB_0018acd0;
                cur_sps->anchor_ref_l0[local_40][lVar8] = _out;
                uVar10 = local_40;
              }
            }
            MVar3 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
            uVar10 = local_40;
            (phVar2->bitctx).ret = MVar3;
            if (MVar3 != MPP_OK) goto LAB_0018acd0;
            pRVar5 = cur_sps->num_anchor_refs_l1;
            pRVar5[local_40] = _out;
            lVar8 = (long)pRVar5[local_40];
            if (lVar8 != 0) {
              pRVar5 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",lVar8 << 2);
              cur_sps->anchor_ref_l1[uVar10] = pRVar5;
              if (cur_sps->anchor_ref_l1[uVar10] == (RK_S32 *)0x0) {
                MVar3 = MPP_ERR_MALLOC;
                if (((byte)h264d_debug & 1) == 0) goto LAB_0018af1e;
                fmt = "malloc buffer error(%d).\n";
                uVar9 = 0x152;
                goto LAB_0018af17;
              }
              for (lVar8 = 0; lVar8 < cur_sps->num_anchor_refs_l1[uVar10]; lVar8 = lVar8 + 1) {
                MVar3 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
                (phVar2->bitctx).ret = MVar3;
                if (MVar3 != MPP_OK) goto LAB_0018acd0;
                cur_sps->anchor_ref_l1[local_40][lVar8] = _out;
                uVar10 = local_40;
              }
            }
            local_40 = uVar10 + 1;
          }
          local_40 = 1;
          while (local_40 != local_38) {
            MVar3 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
            uVar10 = local_40;
            (phVar2->bitctx).ret = MVar3;
            if (MVar3 != MPP_OK) goto LAB_0018acd0;
            pRVar5 = cur_sps->num_non_anchor_refs_l0;
            pRVar5[local_40] = _out;
            lVar8 = (long)pRVar5[local_40];
            if (lVar8 != 0) {
              pRVar5 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",lVar8 << 2);
              cur_sps->non_anchor_ref_l0[uVar10] = pRVar5;
              if (cur_sps->non_anchor_ref_l0[uVar10] != (RK_S32 *)0x0) {
                for (lVar8 = 0; lVar8 < cur_sps->num_non_anchor_refs_l0[uVar10]; lVar8 = lVar8 + 1)
                {
                  MVar3 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
                  (phVar2->bitctx).ret = MVar3;
                  if (MVar3 != MPP_OK) goto LAB_0018acd0;
                  cur_sps->non_anchor_ref_l0[local_40][lVar8] = _out;
                  uVar10 = local_40;
                }
                goto LAB_0018b1f4;
              }
              if (((byte)h264d_debug & 1) != 0) {
                uVar9 = 0x15c;
LAB_0018b374:
                _mpp_log_l(4,"h264d_sps","malloc buffer error(%d).\n",(char *)0x0,uVar9);
              }
LAB_0018b37b:
              MVar3 = MPP_ERR_MALLOC;
              goto LAB_0018af1e;
            }
LAB_0018b1f4:
            MVar3 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
            uVar10 = local_40;
            (phVar2->bitctx).ret = MVar3;
            if (MVar3 != MPP_OK) goto LAB_0018acd0;
            pRVar5 = cur_sps->num_non_anchor_refs_l1;
            pRVar5[local_40] = _out;
            lVar8 = (long)pRVar5[local_40];
            if (lVar8 != 0) {
              pRVar5 = (RK_S32 *)mpp_osal_calloc("sps_mvc_extension",lVar8 << 2);
              cur_sps->non_anchor_ref_l1[uVar10] = pRVar5;
              if (cur_sps->non_anchor_ref_l1[uVar10] == (RK_S32 *)0x0) {
                if (((byte)h264d_debug & 1) != 0) {
                  uVar9 = 0x164;
                  goto LAB_0018b374;
                }
                goto LAB_0018b37b;
              }
              for (lVar8 = 0; lVar8 < cur_sps->num_non_anchor_refs_l1[uVar10]; lVar8 = lVar8 + 1) {
                MVar3 = mpp_read_ue(p_bitctx,(RK_U32 *)&_out);
                (phVar2->bitctx).ret = MVar3;
                if (MVar3 != MPP_OK) goto LAB_0018acd0;
                cur_sps->non_anchor_ref_l1[local_40][lVar8] = _out;
                uVar10 = local_40;
              }
            }
            local_40 = uVar10 + 1;
          }
          goto LAB_0018acd8;
        }
        MVar3 = MPP_ERR_VALUE;
        if (((byte)h264d_debug & 4) != 0) {
          fmt = "value error(%d).\n";
          uVar9 = 0x130;
LAB_0018af17:
          _mpp_log_l(4,"h264d_sps",fmt,(char *)0x0,uVar9);
        }
      }
      else {
LAB_0018acd0:
        if (MPP_NOK < MVar3) {
LAB_0018acd8:
          MVar3 = mpp_read_bits(p_bitctx,1,&_out);
          (phVar2->bitctx).ret = MVar3;
          if (MVar3 == MPP_OK) {
            cur_sps->mvc_vui_parameters_present_flag = _out;
            goto LAB_0018ab84;
          }
          goto LAB_0018ab7a;
        }
      }
LAB_0018af1e:
      if (((byte)h264d_debug & 4) != 0) {
        _mpp_log_l(4,"h264d_sps","Function error(%d).\n",(char *)0x0,0x17a);
      }
    }
    else {
LAB_0018ab7a:
      if (MPP_NOK < MVar3) {
LAB_0018ab84:
        if ((cur_sps->sps).Valid != 0) {
          cur_sps->Valid = 1;
          currSlice->p_Vid->profile_idc = (cur_sps->sps).profile_idc;
        }
        get_max_dec_frame_buf_size(&cur_sps->sps);
        phVar4 = currSlice->p_Vid->subspsSet[(cur_sps->sps).seq_parameter_set_id];
        if (phVar4 == (h264_subsps_t *)0x0) {
          phVar4 = (h264_subsps_t *)mpp_osal_calloc("process_subsps",0x10c0);
          uVar1 = (cur_sps->sps).seq_parameter_set_id;
          currSlice->p_Vid->subspsSet[uVar1] = phVar4;
          phVar4 = currSlice->p_Vid->subspsSet[uVar1];
        }
        if (phVar4->Valid != 0) {
          recycle_subsps(phVar4);
        }
        memcpy(phVar4,cur_sps,0x10c0);
        return MPP_OK;
      }
    }
    if (((byte)h264d_debug & 4) == 0) goto LAB_0018af71;
    uVar9 = 0x225;
  }
  _mpp_log_l(4,"h264d_sps","Function error(%d).\n",(char *)0x0,uVar9);
LAB_0018af71:
  recycle_subsps(currSlice->p_Cur->subsps);
  return MVar3;
}

Assistant:

MPP_RET process_subsps(H264_SLICE_t *currSlice)
{
    MPP_RET ret = MPP_ERR_UNKNOW;

    BitReadCtx_t *p_bitctx = &currSlice->p_Cur->bitctx;
    H264_subSPS_t *cur_subsps = NULL;
    H264_subSPS_t *p_subset = NULL;

    if (!currSlice->p_Cur->subsps)
        currSlice->p_Cur->subsps = mpp_calloc(H264_subSPS_t, 1);

    cur_subsps = currSlice->p_Cur->subsps;
    reset_cur_subpps_data(cur_subsps); //reset

    FUN_CHECK(ret = parser_sps(p_bitctx, &cur_subsps->sps, currSlice->p_Dec));
    FUN_CHECK(ret = parser_subsps_ext(p_bitctx, cur_subsps));
    if (cur_subsps->sps.Valid) {
        cur_subsps->Valid = 1;
        currSlice->p_Vid->profile_idc = cur_subsps->sps.profile_idc;
    }
    get_max_dec_frame_buf_size(&cur_subsps->sps);
    //!< make subSPS available
    if (!currSlice->p_Vid->subspsSet[cur_subsps->sps.seq_parameter_set_id])
        currSlice->p_Vid->subspsSet[cur_subsps->sps.seq_parameter_set_id] = mpp_calloc(H264_subSPS_t, 1);
    p_subset = currSlice->p_Vid->subspsSet[cur_subsps->sps.seq_parameter_set_id];
    if (p_subset->Valid) {
        recycle_subsps(p_subset);
    }
    memcpy(p_subset, cur_subsps, sizeof(H264_subSPS_t));

    return ret = MPP_OK;
__FAILED:
    recycle_subsps(currSlice->p_Cur->subsps);

    return ret;
}